

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

char * ecs_get_name(ecs_world_t *world,ecs_entity_t entity)

{
  undefined8 *puVar1;
  EcsName *id;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  if (entity == 0x11a) {
    world_local = (ecs_world_t *)anon_var_dwarf_e735;
  }
  else {
    puVar1 = (undefined8 *)ecs_get_w_entity(world,entity,6);
    if (puVar1 == (undefined8 *)0x0) {
      world_local = (ecs_world_t *)0x0;
    }
    else {
      world_local = (ecs_world_t *)*puVar1;
    }
  }
  return (char *)world_local;
}

Assistant:

const char* ecs_get_name(
    ecs_world_t *world,
    ecs_entity_t entity)
{
    if (entity == EcsSingleton) {
        return "$";
    }

    const EcsName *id = ecs_get(world, entity, EcsName);

    if (id) {
        return id->value;
    } else {
        return NULL;
    }
}